

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void upb_Map_SetEntryValue(upb_Map *map,size_t iter,upb_MessageValue val)

{
  upb_value local_30;
  upb_value v;
  size_t iter_local;
  upb_Map *map_local;
  upb_MessageValue val_local;
  
  val_local.int64_val = val.str_val.size;
  map_local = val.map_val;
  v.val = iter;
  _upb_map_tovalue(&map_local,(long)map->val_size,&local_30,(upb_Arena *)0x0);
  if ((map->is_strtable_dont_copy_me__upb_internal_use_only & 1U) == 0) {
    upb_inttable_setentryvalue(&(map->t).inttable,v.val,local_30);
  }
  else {
    upb_strtable_setentryvalue(&(map->t).strtable,v.val,local_30);
  }
  return;
}

Assistant:

UPB_API void upb_Map_SetEntryValue(upb_Map* map, size_t iter,
                                   upb_MessageValue val) {
  upb_value v;
  _upb_map_tovalue(&val, map->val_size, &v, NULL);
  if (map->UPB_PRIVATE(is_strtable)) {
    upb_strtable_setentryvalue(&map->t.strtable, iter, v);
  } else {
    upb_inttable_setentryvalue(&map->t.inttable, iter, v);
  }
}